

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

uint32_t perfetto::SharedMemoryABI::GetUsedChunks(uint32_t page_layout)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = (ulong)(page_layout >> 0x1c & 7);
  uVar1 = 0;
  if (0xfffffffffffffffa < uVar3 - 6) {
    iVar2 = 0;
    uVar1 = 0;
    do {
      uVar4 = 1 << ((byte)iVar2 & 0x1f);
      if ((page_layout & 3) == 0) {
        uVar4 = 0;
      }
      uVar1 = uVar1 | uVar4;
      page_layout = page_layout >> 2;
      iVar2 = iVar2 + 1;
    } while (kNumChunksForLayout[uVar3] + (uint)(kNumChunksForLayout[uVar3] == 0) != iVar2);
  }
  return uVar1;
}

Assistant:

static constexpr uint32_t GetNumChunksForLayout(uint32_t page_layout) {
    return kNumChunksForLayout[(page_layout & kLayoutMask) >> kLayoutShift];
  }